

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storage.hpp
# Opt level: O2

Time * __thiscall Storage::Time::operator+=(Time *this,Time *other)

{
  uint uVar1;
  ulong uVar2;
  uint64_t long_clock_rate;
  ulong uVar3;
  uint64_t long_length;
  
  uVar2 = (ulong)other->length;
  if (uVar2 != 0) {
    uVar3 = (ulong)this->length;
    if (uVar3 == 0) {
      *this = *other;
    }
    else {
      long_clock_rate = (uint64_t)this->clock_rate;
      uVar1 = other->clock_rate;
      if (this->clock_rate == uVar1) {
        long_length = uVar3 + uVar2;
      }
      else {
        long_length = uVar3 * uVar1 + uVar2 * long_clock_rate;
        long_clock_rate = long_clock_rate * uVar1;
      }
      install_result(this,long_length,long_clock_rate);
    }
  }
  return this;
}

Assistant:

inline Time &operator += (const Time &other) {
		if(!other.length) return *this;
		if(!length) {
			*this = other;
			return *this;
		}

		uint64_t result_length;
		uint64_t result_clock_rate;
		if(clock_rate == other.clock_rate) {
			result_length = uint64_t(length) + uint64_t(other.length);
			result_clock_rate = uint64_t(clock_rate);
		} else {
			result_length = uint64_t(length) * uint64_t(other.clock_rate) + uint64_t(other.length) * uint64_t(clock_rate);
			result_clock_rate = uint64_t(clock_rate) * uint64_t(other.clock_rate);
		}
		install_result(result_length, result_clock_rate);
		return *this;
	}